

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

char * Curl_copy_header_value(char *header)

{
  char *__s;
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  
  for (lVar6 = 0; (cVar1 = header[lVar6], cVar1 != '\0' && (cVar1 != ':')); lVar6 = lVar6 + 1) {
  }
  pcVar4 = header + (cVar1 != '\0');
  while( true ) {
    cVar1 = pcVar4[lVar6];
    if (((cVar1 != '\t') && (cVar1 != ' ')) && ((cVar1 == '\0' || (3 < (byte)(cVar1 - 10U)))))
    break;
    lVar6 = lVar6 + 1;
  }
  __s = pcVar4 + lVar6;
  pcVar2 = strchr(__s,0xd);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strchr(__s,10);
    if (pcVar2 == (char *)0x0) {
      sVar3 = strlen(__s);
      pcVar2 = __s + sVar3;
    }
  }
  pcVar5 = pcVar2 + (-lVar6 - (long)pcVar4) + 2;
  pcVar4 = pcVar2 + (-lVar6 - (long)pcVar4) + 1;
  for (; __s < pcVar2; pcVar2 = pcVar2 + -1) {
    cVar1 = *pcVar2;
    if (((cVar1 != '\t') && (cVar1 != ' ')) && (3 < (byte)(cVar1 - 10U))) break;
    pcVar5 = pcVar5 + -1;
    pcVar4 = pcVar4 + -1;
  }
  pcVar2 = (char *)(*Curl_cmalloc)((size_t)pcVar5);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    memcpy(pcVar2,__s,(size_t)pcVar4);
    pcVar2[(long)pcVar4] = '\0';
  }
  return pcVar2;
}

Assistant:

char *Curl_copy_header_value(const char *header)
{
  const char *start;
  const char *end;
  char *value;
  size_t len;

  /* Find the end of the header name */
  while(*header && (*header != ':'))
    ++header;

  if(*header)
    /* Skip over colon */
    ++header;

  /* Find the first non-space letter */
  start = header;
  while(*start && ISSPACE(*start))
    start++;

  /* data is in the host encoding so
     use '\r' and '\n' instead of 0x0d and 0x0a */
  end = strchr(start, '\r');
  if(!end)
    end = strchr(start, '\n');
  if(!end)
    end = strchr(start, '\0');
  if(!end)
    return NULL;

  /* skip all trailing space letters */
  while((end > start) && ISSPACE(*end))
    end--;

  /* get length of the type */
  len = end - start + 1;

  value = malloc(len + 1);
  if(!value)
    return NULL;

  memcpy(value, start, len);
  value[len] = 0; /* null-terminate */

  return value;
}